

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::copyAppend
          (QGenericArrayOps<QWindowSystemInterface::TouchPoint> *this,TouchPoint *b,TouchPoint *e)

{
  qsizetype *pqVar1;
  TouchPoint *pTVar2;
  
  if (b != e) {
    pTVar2 = (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).ptr;
    for (; b < e; b = b + 1) {
      QWindowSystemInterface::TouchPoint::TouchPoint
                (pTVar2 + (this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size,b
                );
      pqVar1 = &(this->super_QArrayDataPointer<QWindowSystemInterface::TouchPoint>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }